

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_strerror.cc
# Opt level: O1

void __thiscall tcmalloc::SafeStrError::SafeStrError(SafeStrError *this,int errnum)

{
  char *__s;
  
  switch(errnum) {
  case 1:
    __s = "EPERM";
    break;
  case 2:
    __s = "ENOENT";
    break;
  case 3:
    __s = "ESRCH";
    break;
  case 4:
    __s = "EINTR";
    break;
  case 5:
    __s = "EIO";
    break;
  case 6:
    __s = "ENXIO";
    break;
  case 7:
    __s = "E2BIG";
    break;
  case 8:
    __s = "ENOEXEC";
    break;
  case 9:
    __s = "EBADF";
    break;
  case 10:
    __s = "ECHILD";
    break;
  case 0xb:
    __s = "EAGAIN";
    break;
  case 0xc:
    __s = "ENOMEM";
    break;
  case 0xd:
    __s = "EACCES";
    break;
  case 0xe:
    __s = "EFAULT";
    break;
  default:
    this->result_ = (char *)0x0;
    __s = this->buf_;
    snprintf(__s,0x20,"errno %d");
    break;
  case 0x10:
    __s = "EBUSY";
    break;
  case 0x11:
    __s = "EEXIST";
    break;
  case 0x12:
    __s = "EXDEV";
    break;
  case 0x13:
    __s = "ENODEV";
    break;
  case 0x14:
    __s = "ENOTDIR";
    break;
  case 0x15:
    __s = "EISDIR";
    break;
  case 0x16:
    __s = "EINVAL";
    break;
  case 0x17:
    __s = "ENFILE";
    break;
  case 0x18:
    __s = "EMFILE";
    break;
  case 0x19:
    __s = "ENOTTY";
    break;
  case 0x1a:
    __s = "ETXTBSY";
    break;
  case 0x1b:
    __s = "EFBIG";
    break;
  case 0x1c:
    __s = "ENOSPC";
    break;
  case 0x1d:
    __s = "ESPIPE";
    break;
  case 0x1e:
    __s = "EROFS";
    break;
  case 0x1f:
    __s = "EMLINK";
    break;
  case 0x20:
    __s = "EPIPE";
    break;
  case 0x21:
    __s = "EDOM";
    break;
  case 0x22:
    __s = "ERANGE";
    break;
  case 0x23:
    __s = "EDEADLK";
    break;
  case 0x24:
    __s = "ENAMETOOLONG";
    break;
  case 0x25:
    __s = "ENOLCK";
    break;
  case 0x26:
    __s = "ENOSYS";
    break;
  case 0x27:
    __s = "ENOTEMPTY";
    break;
  case 0x28:
    __s = "ELOOP";
    break;
  case 0x2a:
    __s = "ENOMSG";
    break;
  case 0x2b:
    __s = "EIDRM";
    break;
  case 0x3c:
    __s = "ENOSTR";
    break;
  case 0x3d:
    __s = "ENODATA";
    break;
  case 0x3e:
    __s = "ETIME";
    break;
  case 0x3f:
    __s = "ENOSR";
    break;
  case 0x43:
    __s = "ENOLINK";
    break;
  case 0x47:
    __s = "EPROTO";
    break;
  case 0x48:
    __s = "EMULTIHOP";
    break;
  case 0x4a:
    __s = "EBADMSG";
    break;
  case 0x4b:
    __s = "EOVERFLOW";
    break;
  case 0x54:
    __s = "EILSEQ";
    break;
  case 0x58:
    __s = "ENOTSOCK";
    break;
  case 0x59:
    __s = "EDESTADDRREQ";
    break;
  case 0x5a:
    __s = "EMSGSIZE";
    break;
  case 0x5b:
    __s = "EPROTOTYPE";
    break;
  case 0x5c:
    __s = "ENOPROTOOPT";
    break;
  case 0x5d:
    __s = "EPROTONOSUPPORT";
    break;
  case 0x5f:
    __s = "ENOTSUP";
    break;
  case 0x61:
    __s = "EAFNOSUPPORT";
    break;
  case 0x62:
    __s = "EADDRINUSE";
    break;
  case 99:
    __s = "EADDRNOTAVAIL";
    break;
  case 100:
    __s = "ENETDOWN";
    break;
  case 0x65:
    __s = "ENETUNREACH";
    break;
  case 0x66:
    __s = "ENETRESET";
    break;
  case 0x67:
    __s = "ECONNABORTED";
    break;
  case 0x68:
    __s = "ECONNRESET";
    break;
  case 0x69:
    __s = "ENOBUFS";
    break;
  case 0x6a:
    __s = "EISCONN";
    break;
  case 0x6b:
    __s = "ENOTCONN";
    break;
  case 0x6e:
    __s = "ETIMEDOUT";
    break;
  case 0x6f:
    __s = "ECONNREFUSED";
    break;
  case 0x71:
    __s = "EHOSTUNREACH";
    break;
  case 0x72:
    __s = "EALREADY";
    break;
  case 0x73:
    __s = "EINPROGRESS";
    break;
  case 0x74:
    __s = "ESTALE";
    break;
  case 0x7a:
    __s = "EDQUOT";
    break;
  case 0x7d:
    __s = "ECANCELED";
    break;
  case 0x82:
    __s = "EOWNERDEAD";
    break;
  case 0x83:
    __s = "ENOTRECOVERABLE";
  }
  this->result_ = __s;
  return;
}

Assistant:

SafeStrError::SafeStrError(int errnum) {
  result_ = TryMapErrno(errnum);
  if (result_ == nullptr) {
    snprintf(buf_, sizeof(buf_), "errno %d", errnum);
    result_ = buf_;
  }
}